

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O0

binarydata *
NetworkDataType::serializedata<bool_const,bool_const,bool_const,bool_const>
          (bool *args,bool *args_1,bool *args_2,bool *args_3)

{
  Options OVar1;
  binarydata *in_RDI;
  PortableBinaryOutputArchive archive;
  ostringstream stream;
  string *in_stack_fffffffffffffcf8;
  binarydata *args_2_00;
  undefined7 in_stack_fffffffffffffd10;
  bool *in_stack_fffffffffffffd18;
  OutputArchive<cereal::PortableBinaryOutputArchive,_1U> *in_stack_fffffffffffffd20;
  Options *in_stack_fffffffffffffd30;
  ostream *in_stack_fffffffffffffd38;
  PortableBinaryOutputArchive *in_stack_fffffffffffffd40;
  ostringstream local_1a0 [416];
  
  args_2_00 = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  OVar1 = cereal::PortableBinaryOutputArchive::Options::Default();
  cereal::PortableBinaryOutputArchive::PortableBinaryOutputArchive
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  cereal::OutputArchive<cereal::PortableBinaryOutputArchive,1u>::operator()
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
             (bool *)CONCAT17(OVar1.itsOutputEndianness,in_stack_fffffffffffffd10),(bool *)args_2_00
             ,(bool *)in_RDI);
  std::__cxx11::ostringstream::str();
  binarydata::binarydata(in_RDI,in_stack_fffffffffffffcf8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd18);
  cereal::PortableBinaryOutputArchive::~PortableBinaryOutputArchive
            ((PortableBinaryOutputArchive *)0x2130ea);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return args_2_00;
}

Assistant:

static binarydata serializedata(T & ... args){
        std::ostringstream stream;
        cereal::PortableBinaryOutputArchive archive(stream);
        archive(args...);
        return binarydata(stream.str());
    }